

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  bool bVar1;
  int iVar2;
  int rc;
  int iVar3;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar2 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar2 == 0)) {
    iVar2 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2174e,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    rc = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
    if (rc != 0) {
      iVar2 = 0;
      do {
        if (db->mallocFailed != '\0') break;
        iVar3 = iVar2;
        if ((rc != 0x201) || (iVar3 = iVar2 + 1, bVar1 = 0x18 < iVar2, iVar2 = iVar3, bVar1)) {
          if (rc != 0x11) break;
          sqlite3ResetOneSchema(db,-1);
          if (iVar3 != 0) break;
          iVar2 = 1;
        }
        rc = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
      } while (rc != 0);
    }
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    if ((rc != 0) || (iVar2 = 0, db->mallocFailed != '\0')) {
      iVar2 = apiHandleError(db,rc);
    }
    (db->busyHandler).nBusy = 0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar2;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
    if( rc==SQLITE_OK || db->mallocFailed ) break;
  }while( (rc==SQLITE_ERROR_RETRY && (cnt++)<SQLITE_MAX_PREPARE_RETRY)
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  db->busyHandler.nBusy = 0;
  sqlite3_mutex_leave(db->mutex);
  return rc;
}